

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O2

bool __thiscall wasm::anon_unknown_23::Heap2Local::canHandleAsLocals(Heap2Local *this,Type type)

{
  pointer pFVar1;
  bool bVar2;
  bool bVar3;
  Struct *pSVar4;
  pointer pFVar5;
  Type local_40 [2];
  Type local_30;
  Type type_local;
  HeapType heapType;
  
  if (this == (Heap2Local *)0x1) {
    bVar2 = false;
  }
  else {
    local_30.id = (uintptr_t)this;
    type_local.id = (uintptr_t)wasm::Type::getHeapType(&local_30);
    bVar2 = HeapType::isStruct((HeapType *)&type_local);
    if (bVar2) {
      pSVar4 = HeapType::getStruct((HeapType *)&type_local);
      pFVar5 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar1 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        bVar2 = pFVar5 == pFVar1;
        if (bVar2) {
          return bVar2;
        }
        bVar3 = TypeUpdating::canHandleAsLocal((Type)(pFVar5->type).id);
        pFVar5 = pFVar5 + 1;
      } while (bVar3);
    }
    else {
      bVar2 = HeapType::isArray((HeapType *)&type_local);
      if (!bVar2) {
        __assert_fail("heapType.isArray()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                      ,0x581,"bool wasm::(anonymous namespace)::Heap2Local::canHandleAsLocals(Type)"
                     );
      }
      HeapType::getArray((HeapType *)local_40);
      bVar2 = TypeUpdating::canHandleAsLocal(local_40[0]);
    }
  }
  return bVar2;
}

Assistant:

bool canHandleAsLocals(Type type) {
    if (type == Type::unreachable) {
      return false;
    }

    auto heapType = type.getHeapType();
    if (heapType.isStruct()) {
      auto& fields = heapType.getStruct().fields;
      for (auto field : fields) {
        if (!canHandleAsLocal(field)) {
          return false;
        }
      }
      return true;
    }

    assert(heapType.isArray());
    return canHandleAsLocal(heapType.getArray().element);
  }